

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O0

void __thiscall
cs::method_import_as::preprocess
          (method_import_as *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  initializer_list<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
  __l;
  int iVar1;
  const_reference pptVar2;
  token_base **pptVar3;
  undefined8 uVar4;
  var_id *this_00;
  undefined1 *puVar5;
  bool bVar6;
  var ext;
  string *alias_name;
  token_base *token_alias;
  tree_type<cs::token_base_*> *tree_alias;
  tree_type<cs::token_base_*> *tree_package;
  string *in_stack_fffffffffffffe28;
  compiler_type *in_stack_fffffffffffffe30;
  deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *in_stack_fffffffffffffe40;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffe48;
  pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
  *in_stack_fffffffffffffe50;
  allocator_type *in_stack_fffffffffffffe58;
  undefined1 *puVar7;
  statement_import *in_stack_fffffffffffffe60;
  iterator in_stack_fffffffffffffe68;
  iterator *in_stack_fffffffffffffe70;
  undefined1 local_121;
  undefined1 *local_120;
  undefined1 local_118 [40];
  var *in_stack_ffffffffffffff10;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_ffffffffffffff18;
  domain_manager *in_stack_ffffffffffffff20;
  allocator local_a1;
  string local_a0 [32];
  tree_node *local_80;
  token_id *local_78;
  undefined1 local_6d;
  context_t *in_stack_ffffffffffffff98;
  method_import_as *in_stack_ffffffffffffffa0;
  iterator in_stack_ffffffffffffffa8;
  
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffe40);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
  token_expr::get_tree((token_expr *)*pptVar2);
  std::
  deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
  ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           *)in_stack_fffffffffffffe40);
  pptVar2 = std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::at
                      ((deque<cs::token_base_*,_std::allocator<cs::token_base_*>_> *)
                       in_stack_fffffffffffffe30,(size_type)in_stack_fffffffffffffe28);
  token_expr::get_tree((token_expr *)*pptVar2);
  tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe28);
  pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffe70);
  bVar6 = true;
  if (*pptVar3 != (token_base *)0x0) {
    tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe28);
    pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffe70);
    bVar6 = *pptVar3 == (token_base *)0x0;
  }
  if (!bVar6) {
    local_80 = (tree_node *)
               tree_type<cs::token_base_*>::root
                         ((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe28);
    pptVar3 = tree_type<cs::token_base_*>::iterator::data(in_stack_fffffffffffffe70);
    local_78 = (token_id *)*pptVar3;
    iVar1 = (*(local_78->super_token_base)._vptr_token_base[2])();
    if (iVar1 != 4) {
      uVar4 = __cxa_allocate_exception(0x28);
      std::allocator<char>::allocator();
      std::__cxx11::string::string
                (local_a0,"Wrong grammar for import-as statement, expect <id> in alias.",&local_a1);
      compile_error::compile_error
                ((compile_error *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
      __cxa_throw(uVar4,&compile_error::typeinfo,compile_error::~compile_error);
    }
    this_00 = token_id::get_id(local_78);
    var_id::get_id_abi_cxx11_(this_00);
    tree_type<cs::token_base_*>::root((tree_type<cs::token_base_*> *)in_stack_fffffffffffffe28);
    get_namespace(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98,in_stack_ffffffffffffffa8);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x561ab4);
    std::__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::compiler_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x561abc);
    compiler_type::add_constant(in_stack_fffffffffffffe30,(var *)in_stack_fffffffffffffe28);
    std::__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::operator->
              ((__shared_ptr_access<cs::context_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x561ad8);
    std::__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator->((__shared_ptr_access<cs::instance_type,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
               0x561ae4);
    domain_manager::add_var_no_return<std::__cxx11::string_const&>
              (in_stack_ffffffffffffff20,in_stack_ffffffffffffff18,in_stack_ffffffffffffff10);
    statement_base::operator_new((size_t)in_stack_fffffffffffffe30);
    local_120 = local_118;
    std::
    pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
    ::pair<cs_impl::any_&,_true>
              (in_stack_fffffffffffffe50,in_stack_fffffffffffffe48,(any *)in_stack_fffffffffffffe40)
    ;
    puVar7 = &local_121;
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
    ::allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
                 *)0x561b81);
    __l._M_len = (size_type)puVar7;
    __l._M_array = in_stack_fffffffffffffe68;
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
              *)in_stack_fffffffffffffe60,__l,in_stack_fffffffffffffe58);
    std::shared_ptr<cs::context_type>::shared_ptr
              ((shared_ptr<cs::context_type> *)in_stack_fffffffffffffe30,
               (shared_ptr<cs::context_type> *)in_stack_fffffffffffffe28);
    std::
    deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
    ::front((deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
             *)in_stack_fffffffffffffe40);
    std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>::back(in_stack_fffffffffffffe40)
    ;
    statement_import::statement_import
              (in_stack_fffffffffffffe60,
               (vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
                *)in_stack_fffffffffffffe58,(context_t *)in_stack_fffffffffffffe50,
               (token_base *)in_stack_fffffffffffffe48);
    std::deque<cs::statement_base*,std::allocator<cs::statement_base*>>::
    emplace_back<cs::statement_import*>
              ((deque<cs::statement_base_*,_std::allocator<cs::statement_base_*>_> *)
               in_stack_fffffffffffffe30,(statement_import **)in_stack_fffffffffffffe28);
    std::shared_ptr<cs::context_type>::~shared_ptr((shared_ptr<cs::context_type> *)0x561c26);
    std::
    vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
    ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>_>
               *)in_stack_fffffffffffffe40);
    std::
    allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
    ::~allocator((allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>_>
                  *)0x561c40);
    puVar7 = local_118;
    puVar5 = &stack0xffffffffffffff10;
    do {
      puVar5 = puVar5 + -0x28;
      std::
      pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
      ::~pair((pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cs_impl::any>
               *)in_stack_fffffffffffffe30);
    } while (puVar5 != puVar7);
    cs_impl::any::~any((any *)0x561c8a);
    return;
  }
  local_6d = 1;
  uVar4 = __cxa_allocate_exception(0x28);
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&stack0xffffffffffffffa8,"Null pointer accessed.",
             (allocator *)&stack0xffffffffffffffa7);
  internal_error::internal_error
            ((internal_error *)in_stack_fffffffffffffe30,in_stack_fffffffffffffe28);
  local_6d = 0;
  __cxa_throw(uVar4,&internal_error::typeinfo,internal_error::~internal_error);
}

Assistant:

void method_import_as::preprocess(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		tree_type<token_base *> &tree_package = static_cast<token_expr *>(raw.front().at(1))->get_tree();
		tree_type<token_base *> &tree_alias = static_cast<token_expr *>(raw.front().at(3))->get_tree();
		if (tree_package.root().data() == nullptr || tree_alias.root().data() == nullptr)
			throw internal_error("Null pointer accessed.");
		token_base *token_alias = tree_alias.root().data();
		if (token_alias->get_type() != token_types::id)
			throw compile_error("Wrong grammar for import-as statement, expect <id> in alias.");
		const string &alias_name = static_cast<token_id *>(token_alias)->get_id().get_id();
		var ext = get_namespace(context, tree_package.root());
		context->compiler->add_constant(ext);
		context->instance->storage.add_var_no_return(alias_name, ext);
		mResult.emplace_back(new statement_import({{alias_name, ext}}, context, raw.front().back()));
	}